

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<float>
          (AsciiParser *this,char sep,vector<float,_std::allocator<float>_> *result)

{
  pointer pfVar1;
  iterator iVar2;
  StreamReader *pSVar3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  float value;
  float value_1;
  float local_54;
  string local_50;
  
  pfVar1 = (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pfVar1) {
    (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pfVar1;
  }
  bVar4 = SkipWhitespaceAndNewline(this,true);
  if (bVar4) {
    bVar4 = ReadBasicType(this,&local_54);
    if (bVar4) {
      iVar2._M_current =
           (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)result,iVar2,&local_54);
      }
      else {
        *iVar2._M_current = local_54;
        (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Not starting with the value of requested type.\n","");
      PushError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar4) {
      do {
        pSVar3 = this->_sr;
        if ((pSVar3->length_ <= pSVar3->idx_) || (pSVar3->binary_[pSVar3->idx_] == '\0'))
        goto LAB_003a62f6;
        bVar4 = SkipWhitespaceAndNewline(this,true);
        if (!bVar4) {
          return false;
        }
        bVar4 = Char1(this,(char *)&local_54);
        iVar6 = 1;
        if (bVar4) {
          if (local_54._0_1_ == sep) {
            bVar4 = SkipWhitespaceAndNewline(this,true);
            if (bVar4) {
              bVar4 = ReadBasicType(this,(float *)&local_50);
              iVar6 = 3;
              if (bVar4) {
                iVar2._M_current =
                     (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar2._M_current ==
                    (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)result,iVar2,(float *)&local_50)
                  ;
                }
                else {
                  *iVar2._M_current = local_50._M_dataplus._M_p._0_4_;
                  (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                }
                iVar6 = 0;
              }
            }
          }
          else {
            pSVar3 = this->_sr;
            iVar6 = 3;
            if ((0 < (long)pSVar3->idx_) && (uVar5 = pSVar3->idx_ - 1, uVar5 <= pSVar3->length_)) {
              pSVar3->idx_ = uVar5;
            }
          }
        }
      } while (iVar6 == 0);
      if (iVar6 != 1) {
LAB_003a62f6:
        if ((result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          return true;
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Empty array.\n","");
        PushError(this,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    // sep
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}